

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O0

GetUnblindedAddressResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::GetUnblindedAddressRequestStruct,cfd::js::api::GetUnblindedAddressResponseStruct>
          (GetUnblindedAddressResponseStruct *__return_storage_ptr__,api *this,
          GetUnblindedAddressRequestStruct *request,
          function<cfd::js::api::GetUnblindedAddressResponseStruct_(const_cfd::js::api::GetUnblindedAddressRequestStruct_&)>
          *call_function,string *fuction_name)

{
  CfdException *cfde;
  exception *except;
  GetUnblindedAddressResponseStruct local_128;
  undefined1 local_29;
  function<cfd::js::api::GetUnblindedAddressResponseStruct_(const_cfd::js::api::GetUnblindedAddressRequestStruct_&)>
  *local_28;
  string *fuction_name_local;
  function<cfd::js::api::GetUnblindedAddressResponseStruct_(const_cfd::js::api::GetUnblindedAddressRequestStruct_&)>
  *call_function_local;
  GetUnblindedAddressRequestStruct *request_local;
  GetUnblindedAddressResponseStruct *response;
  
  local_29 = 0;
  local_28 = call_function;
  fuction_name_local = &request->confidential_address;
  call_function_local =
       (function<cfd::js::api::GetUnblindedAddressResponseStruct_(const_cfd::js::api::GetUnblindedAddressRequestStruct_&)>
        *)this;
  request_local = (GetUnblindedAddressRequestStruct *)__return_storage_ptr__;
  GetUnblindedAddressResponseStruct::GetUnblindedAddressResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::GetUnblindedAddressResponseStruct_(const_cfd::js::api::GetUnblindedAddressRequestStruct_&)>
  ::operator()(&local_128,
               (function<cfd::js::api::GetUnblindedAddressResponseStruct_(const_cfd::js::api::GetUnblindedAddressRequestStruct_&)>
                *)request,(GetUnblindedAddressRequestStruct *)call_function_local);
  GetUnblindedAddressResponseStruct::operator=(__return_storage_ptr__,&local_128);
  GetUnblindedAddressResponseStruct::~GetUnblindedAddressResponseStruct(&local_128);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}